

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O0

AVSValue __thiscall
AVSInterface::Create<MiniDeen>
          (AVSInterface *this,AVSValue *args,void *user_data,IScriptEnvironment *env)

{
  AVSWrapper<MiniDeen> *this_00;
  anon_union_8_9_d3d94a0b_for_AVSValue_2 extraout_RDX;
  AVSValue AVar1;
  char *err;
  AVSValue local_40;
  AVSWrapper<MiniDeen> *local_30;
  AVSWrapper<MiniDeen> *filter;
  IScriptEnvironment *env_local;
  void *user_data_local;
  AVSValue *args_local;
  
  filter = (AVSWrapper<MiniDeen> *)env;
  env_local = (IScriptEnvironment *)user_data;
  user_data_local = args;
  args_local = (AVSValue *)this;
  this_00 = (AVSWrapper<MiniDeen> *)operator_new(0x118);
  AVSValue::AVSValue(&local_40,args);
  AVSWrapper<MiniDeen>::AVSWrapper(this_00,&local_40,(IScriptEnvironment *)filter);
  AVSValue::~AVSValue(&local_40);
  local_30 = this_00;
  AVSWrapper<MiniDeen>::Initialize(this_00);
  AVSValue::AVSValue((AVSValue *)this,&local_30->super_IClip);
  AVar1.field_2.clip = extraout_RDX.clip;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AVSValue __cdecl Create(AVSValue args, void* user_data, IScriptEnvironment* env)
  {
    auto filter = new AVSWrapper<FilterType>(args, env);
    try {
      filter->Initialize();
    }
    catch (const char *err) {
      env->ThrowError("%s: %s", filter->data.AVSName(), err);
    }
    return filter;
  }